

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void sysbvm_dwarf_debugInfo_location_constUnsigned
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t constant)

{
  uintptr_t constant_local;
  sysbvm_dwarf_debugInfo_builder_t *builder_local;
  
  if (constant < 0x20) {
    sysbvm_dwarf_encodeByte(&builder->locationExpression,(uint8_t)constant + '0');
  }
  else if (constant < 0x100) {
    sysbvm_dwarf_encodeByte(&builder->locationExpression,'\b');
    sysbvm_dwarf_encodeByte(&builder->locationExpression,(uint8_t)constant);
  }
  else if (constant < 0x10000) {
    sysbvm_dwarf_encodeByte(&builder->locationExpression,'\n');
    sysbvm_dwarf_encodeWord(&builder->locationExpression,(uint16_t)constant);
  }
  else if (constant < 0x100000000) {
    sysbvm_dwarf_encodeByte(&builder->locationExpression,'\f');
    sysbvm_dwarf_encodeDWord(&builder->locationExpression,(uint32_t)constant);
  }
  else {
    sysbvm_dwarf_encodeByte(&builder->locationExpression,'\x0e');
    sysbvm_dwarf_encodeQWord(&builder->locationExpression,constant);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_location_constUnsigned(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t constant)
{
    if(constant <= 31)
    {
        sysbvm_dwarf_encodeByte(&builder->locationExpression, DW_OP_lit0 + (uint8_t)constant);
        return;
    }

    if(constant <= 0xFF)
    {
        sysbvm_dwarf_encodeByte(&builder->locationExpression, DW_OP_const1u);
        sysbvm_dwarf_encodeByte(&builder->locationExpression, (uint8_t)constant);
        return;
    }

    if(constant <= 0xFFFF)
    {
        sysbvm_dwarf_encodeByte(&builder->locationExpression, DW_OP_const2u);
        sysbvm_dwarf_encodeWord(&builder->locationExpression, (uint16_t)constant);
        return;
    }

    if(constant <= 0xFFFFFFFF)
    {
        sysbvm_dwarf_encodeByte(&builder->locationExpression, DW_OP_const4u);
        sysbvm_dwarf_encodeDWord(&builder->locationExpression, (uint32_t)constant);
        return;
    }

    sysbvm_dwarf_encodeByte(&builder->locationExpression, DW_OP_const8u);
    sysbvm_dwarf_encodeQWord(&builder->locationExpression, (uint64_t)constant);
}